

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O2

void hiberlite::
     hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,std::vector<int,std::allocator<int>>>
               (AVisitor<hiberlite::KillChildren> *ar,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *v,uint param_3)

{
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  body;
  allocator local_e9;
  string local_e8;
  stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_c8;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_a0;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_58;
  
  std::__cxx11::string::string((string *)&local_e8,"items",&local_e9);
  local_c8.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_c8.xx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.it._M_current =
       (v->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_c8.ct = v;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::collection_nvp(&local_58,&local_e8,&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_c8.xx.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&local_e8);
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::collection_nvp(&local_a0,&local_58);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_a0);
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~collection_nvp(&local_a0);
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~collection_nvp(&local_58);
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}